

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O1

Own<capnp::compiler::BrandScope,_std::nullptr_t> __thiscall
capnp::compiler::BrandScope::pop(BrandScope *this,uint64_t newLeafId)

{
  _func_int *p_Var1;
  Refcounted *refcounted_1;
  _func_int **pp_Var2;
  BrandScope *in_RDX;
  BrandScope *extraout_RDX;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> OVar3;
  
  do {
    if (*(BrandScope **)(newLeafId + 0x28) == in_RDX) {
      *(int *)(newLeafId + 8) = *(int *)(newLeafId + 8) + 1;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)newLeafId;
      *(uint64_t *)&(this->super_Refcounted).refcount = newLeafId;
LAB_003faed2:
      OVar3.ptr = in_RDX;
      OVar3.disposer = (Disposer *)this;
      return OVar3;
    }
    if (*(_func_int **)(newLeafId + 0x20) == (_func_int *)0x0) {
      p_Var1 = *(_func_int **)(newLeafId + 0x10);
      pp_Var2 = (_func_int **)operator_new(0x50);
      *pp_Var2 = (_func_int *)&PTR_disposeImpl_007021d0;
      pp_Var2[2] = p_Var1;
      pp_Var2[3] = (_func_int *)0x0;
      pp_Var2[4] = (_func_int *)0x0;
      pp_Var2[5] = (_func_int *)in_RDX;
      *(undefined4 *)(pp_Var2 + 6) = 0;
      *(undefined1 *)((long)pp_Var2 + 0x34) = 0;
      pp_Var2[7] = (_func_int *)0x0;
      pp_Var2[8] = (_func_int *)0x0;
      pp_Var2[9] = (_func_int *)0x0;
      *(undefined4 *)(pp_Var2 + 1) = 1;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = pp_Var2;
      *(_func_int ***)&(this->super_Refcounted).refcount = pp_Var2;
      in_RDX = extraout_RDX;
      goto LAB_003faed2;
    }
    newLeafId = *(uint64_t *)(newLeafId + 0x20);
  } while( true );
}

Assistant:

kj::Own<BrandScope> BrandScope::pop(uint64_t newLeafId) {
  if (leafId == newLeafId) {
    return kj::addRef(*this);
  }
  KJ_IF_SOME(p, parent) {
    return p->pop(newLeafId);
  } else {
    // Looks like we're moving into a whole top-level scope.
    return kj::refcounted<BrandScope>(errorReporter, newLeafId);
  }
}